

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O1

int key_schedule(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,ptls_aead_context_t **ctx,
                int is_enc,void *shared_secret,ptls_iovec_t info)

{
  size_t delta;
  ptls_iovec_t info_00;
  ptls_iovec_t info_01;
  int iVar1;
  ptls_aead_context_t *ppVar2;
  ptls_iovec_t salt;
  ptls_iovec_t prk;
  ptls_iovec_t prk_00;
  ptls_buffer_t key_schedule_context;
  uint8_t base_nonce [32];
  uint8_t key [32];
  uint8_t secret [64];
  uint8_t key_schedule_context_smallbuf [128];
  undefined1 local_199;
  ptls_buffer_t local_198;
  uint8_t *local_178;
  size_t sStack_170;
  uint8_t *local_168;
  size_t sStack_160;
  char *local_158;
  undefined8 uStack_150;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined8 uStack_100;
  uint8_t local_f8 [64];
  uint8_t local_b8 [136];
  
  *ctx = (ptls_aead_context_t *)0x0;
  local_198.base = local_b8;
  local_198.off = 0;
  local_198.capacity = 0x80;
  local_198._24_8_ = local_198._24_8_ & 0xffffffffffff0000;
  local_199 = 0;
  iVar1 = ptls_buffer__do_pushv(&local_198,&local_199,1);
  if ((iVar1 == 0) &&
     (iVar1 = ptls_buffer_reserve(&local_198,cipher->hash->digest_size), iVar1 == 0)) {
    local_108 = 0;
    uStack_100 = 0;
    iVar1 = labeled_extract(kem,cipher,local_198.base + local_198.off,(ptls_iovec_t)ZEXT816(0),
                            "psk_id_hash",(ptls_iovec_t)ZEXT816(0));
    if (iVar1 == 0) {
      delta = cipher->hash->digest_size;
      local_198.off = local_198.off + delta;
      iVar1 = ptls_buffer_reserve(&local_198,delta);
      if ((iVar1 == 0) &&
         (iVar1 = labeled_extract(kem,cipher,local_198.base + local_198.off,(ptls_iovec_t)ZEXT816(0)
                                  ,"info_hash",info), iVar1 == 0)) {
        local_198.off = local_198.off + cipher->hash->digest_size;
        local_158 = "";
        uStack_150 = 0;
        salt.len = kem->hash->digest_size;
        salt.base = (uint8_t *)shared_secret;
        iVar1 = labeled_extract(kem,cipher,local_f8,salt,"secret",(ptls_iovec_t)ZEXT816(0x13780d));
        if (iVar1 == 0) {
          local_168 = local_198.base;
          sStack_160 = local_198.off;
          info_00.len = local_198.off;
          info_00.base = local_198.base;
          prk.len = cipher->hash->digest_size;
          prk.base = local_f8;
          iVar1 = labeled_expand(kem,cipher,local_128,cipher->aead->key_size,prk,"key",info_00);
          if (iVar1 == 0) {
            local_178 = local_198.base;
            sStack_170 = local_198.off;
            info_01.len = local_198.off;
            info_01.base = local_198.base;
            prk_00.len = cipher->hash->digest_size;
            prk_00.base = local_f8;
            iVar1 = labeled_expand(kem,cipher,local_148,cipher->aead->iv_size,prk_00,"base_nonce",
                                   info_01);
            if (iVar1 == 0) {
              ppVar2 = ptls_aead_new_direct(cipher->aead,is_enc,local_128,local_148);
              *ctx = ppVar2;
              iVar1 = 0;
            }
          }
        }
      }
    }
  }
  ptls_buffer__release_memory(&local_198);
  local_198.off = 0;
  local_198.is_allocated = '\0';
  local_198.align_bits = '\0';
  local_198._26_6_ = 0;
  local_198.base = (uint8_t *)0x0;
  local_198.capacity = 0;
  (*ptls_clear_memory)(local_f8,0x40);
  (*ptls_clear_memory)(local_128,0x20);
  (*ptls_clear_memory)(local_148,0x20);
  return iVar1;
}

Assistant:

static int key_schedule(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_aead_context_t **ctx, int is_enc,
                        const void *shared_secret, ptls_iovec_t info)
{
    ptls_buffer_t key_schedule_context;
    uint8_t key_schedule_context_smallbuf[128], secret[PTLS_MAX_DIGEST_SIZE], key[PTLS_MAX_SECRET_SIZE],
        base_nonce[PTLS_MAX_IV_SIZE];
    int ret;

    *ctx = NULL;

    ptls_buffer_init(&key_schedule_context, key_schedule_context_smallbuf, sizeof(key_schedule_context_smallbuf));

    /* key_schedule_context = concat(mode, LabeledExtract("", "psk_id_hash", psk_id), LabeledExtract("", "info_hash", info)) */
    ptls_buffer_push(&key_schedule_context, PTLS_HPKE_MODE_BASE);
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "psk_id_hash", ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "info_hash", info)) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;

    /* secret = LabeledExtract(shared_secret, "secret", psk) */
    if ((ret = labeled_extract(kem, cipher, secret, ptls_iovec_init(shared_secret, kem->hash->digest_size), "secret",
                               ptls_iovec_init("", 0))) != 0)
        goto Exit;

    /* key, base_nonce */
    if ((ret = labeled_expand(kem, cipher, key, cipher->aead->key_size, ptls_iovec_init(secret, cipher->hash->digest_size), "key",
                              ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;
    if ((ret = labeled_expand(kem, cipher, base_nonce, cipher->aead->iv_size, ptls_iovec_init(secret, cipher->hash->digest_size),
                              "base_nonce", ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;

    *ctx = ptls_aead_new_direct(cipher->aead, is_enc, key, base_nonce);

Exit:
    ptls_buffer_dispose(&key_schedule_context);
    ptls_clear_memory(secret, sizeof(secret));
    ptls_clear_memory(key, sizeof(key));
    ptls_clear_memory(base_nonce, sizeof(base_nonce));
    return ret;
}